

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O0

bool __thiscall crnlib::etc1_optimizer::compute(etc1_optimizer *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  float *pfVar12;
  uchar *__src;
  etc1_solution_coordinates *in_RDI;
  bool bVar13;
  uint8 *pSelectors;
  etc1_solution_coordinates coords1;
  bool skip;
  int bb1;
  int bg1;
  int br1;
  float avg_delta_b_f;
  float avg_delta_g_f;
  float avg_delta_r_f;
  int yd_1;
  uint s;
  uint r;
  color_quad_u8 base_color;
  int delta_sum_b;
  int delta_sum_g;
  int delta_sum_r;
  int *pInten_table;
  uint8 *pSelectors_1;
  uint refinement_trial;
  uint max_refinement_trials;
  etc1_solution_coordinates coords;
  int mbr;
  int xd;
  int xdi;
  int mbg;
  int yd;
  int ydi;
  int mbb;
  int zd;
  int zdi;
  int scan_delta_size;
  uint n;
  undefined4 in_stack_ffffffffffffff2c;
  bool *in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff38;
  float in_stack_ffffffffffffff3c;
  float in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  uint uVar14;
  uint local_74;
  byte local_70;
  byte local_6f;
  byte local_6e;
  int local_6c;
  int local_68;
  int local_64;
  byte *local_58;
  uint local_50;
  int local_34;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  etc1_solution_coordinates *coords_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  uVar20 = *(uint *)(*(long *)in_RDI + 8);
  iVar19 = *(int *)(*(long *)in_RDI + 0x28);
  coords_00 = in_RDI;
  for (iVar18 = 0; iVar18 < iVar19; iVar18 = iVar18 + 1) {
    iVar17 = *(int *)(*(long *)(*(long *)in_RDI + 0x20) + (long)iVar18 * 4);
    uVar1 = in_RDI[3].m_inten_table + iVar17;
    if (-1 < (int)uVar1) {
      if ((int)in_RDI[1].m_inten_table < (int)uVar1) break;
      for (iVar16 = 0; iVar16 < iVar19; iVar16 = iVar16 + 1) {
        iVar15 = *(int *)(*(long *)(*(long *)in_RDI + 0x20) + (long)iVar16 * 4);
        uVar2 = in_RDI[3].m_unscaled_color.field_0.m_u32 + iVar15;
        if (-1 < (int)uVar2) {
          if ((int)in_RDI[1].m_inten_table < (int)uVar2) break;
          for (local_34 = 0; local_34 < iVar19; local_34 = local_34 + 1) {
            iVar5 = *(int *)(*(long *)(*(long *)in_RDI + 0x20) + (long)local_34 * 4);
            uVar3 = *(int *)&in_RDI[2].m_color4 + iVar5;
            if (-1 < (int)uVar3) {
              if ((int)in_RDI[1].m_inten_table < (int)uVar3) break;
              etc1_solution_coordinates::etc1_solution_coordinates
                        ((etc1_solution_coordinates *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         (uint)in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                         (uint)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                         (uint)in_stack_ffffffffffffff30,
                         SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
              if (**(int **)in_RDI == 2) {
                bVar13 = evaluate_solution((etc1_optimizer *)CONCAT44(uVar20,iVar19),
                                           (etc1_solution_coordinates *)CONCAT44(iVar18,iVar17),
                                           (potential_solution *)CONCAT44(uVar1,iVar16),
                                           (potential_solution *)CONCAT44(iVar15,uVar2));
                if (bVar13) {
LAB_0021e23a:
                  if (**(int **)in_RDI == 0) {
                    uVar14 = 2;
                  }
                  else {
                    uVar14 = 2;
                    if ((iVar5 == 0 && iVar15 == 0) && iVar17 == 0) {
                      uVar14 = 4;
                    }
                  }
                  in_stack_ffffffffffffff44 = uVar14;
                  for (local_50 = 0; local_50 < uVar14; local_50 = local_50 + 1) {
                    local_58 = vector<unsigned_char>::get_ptr
                                         ((vector<unsigned_char> *)&in_RDI[0xd].m_inten_table);
                    uVar6 = in_RDI[0xc].m_inten_table;
                    local_64 = 0;
                    local_68 = 0;
                    local_6c = 0;
                    etc1_solution_coordinates::get_scaled_color(in_RDI);
                    for (local_74 = 0; local_74 < uVar20; local_74 = local_74 + 1) {
                      iVar5 = *(int *)(g_etc1_inten_tables +
                                      (ulong)*local_58 * 4 + (ulong)uVar6 * 0x10);
                      iVar4 = math::clamp<int>((uint)local_70 + iVar5,0,0xff);
                      local_64 = (iVar4 - (uint)local_70) + local_64;
                      iVar4 = math::clamp<int>((uint)local_6f + iVar5,0,0xff);
                      local_68 = (iVar4 - (uint)local_6f) + local_68;
                      iVar5 = math::clamp<int>((uint)local_6e + iVar5,0,0xff);
                      local_6c = (iVar5 - (uint)local_6e) + local_6c;
                      local_58 = local_58 + 1;
                    }
                    if (((local_64 == 0) && (local_68 == 0)) && (local_6c == 0)) break;
                    uVar9 = (ulong)uVar20;
                    uVar10 = (ulong)uVar20;
                    uVar11 = (ulong)uVar20;
                    in_stack_ffffffffffffff30 = &in_RDI[1].m_color4;
                    in_stack_ffffffffffffff2c = 0;
                    pfVar12 = vec<3U,_float>::operator[]
                                        ((vec<3U,_float> *)in_stack_ffffffffffffff30,0);
                    in_stack_ffffffffffffff3c = 255.0;
                    in_stack_ffffffffffffff40 = 0.5;
                    uVar6 = math::clamp<int>((int)(long)(((*pfVar12 - (float)local_64 / (float)uVar9
                                                          ) * (float)(int)in_RDI[1].m_inten_table) /
                                                         255.0 + 0.5),0,in_RDI[1].m_inten_table);
                    pfVar12 = vec<3U,_float>::operator[]
                                        ((vec<3U,_float> *)in_stack_ffffffffffffff30,1);
                    uVar7 = math::clamp<int>((int)(long)(((*pfVar12 -
                                                          (float)local_68 / (float)uVar10) *
                                                         (float)(int)in_RDI[1].m_inten_table) /
                                                         in_stack_ffffffffffffff3c +
                                                        in_stack_ffffffffffffff40),0,
                                             in_RDI[1].m_inten_table);
                    pfVar12 = vec<3U,_float>::operator[]
                                        ((vec<3U,_float> *)in_stack_ffffffffffffff30,2);
                    uVar8 = math::clamp<int>((int)(long)(((*pfVar12 -
                                                          (float)local_6c / (float)uVar11) *
                                                         (float)(int)in_RDI[1].m_inten_table) /
                                                         in_stack_ffffffffffffff3c +
                                                        in_stack_ffffffffffffff40),0,
                                             in_RDI[1].m_inten_table);
                    bVar13 = false;
                    if (((uVar3 == uVar6) && (uVar2 == uVar7)) && (uVar1 == uVar8)) {
                      bVar13 = true;
                    }
                    else if (((uVar6 == in_RDI[0xc].m_unscaled_color.field_0.field_0.r) &&
                             (uVar7 == in_RDI[0xc].m_unscaled_color.field_0.field_0.g)) &&
                            (uVar8 == in_RDI[0xc].m_unscaled_color.field_0.field_0.b)) {
                      bVar13 = true;
                    }
                    else if (((*(uint *)&in_RDI[2].m_color4 == uVar6) &&
                             (in_RDI[3].m_unscaled_color.field_0.m_u32 == uVar7)) &&
                            (in_RDI[3].m_inten_table == uVar8)) {
                      bVar13 = true;
                    }
                    if (bVar13) break;
                    etc1_solution_coordinates::etc1_solution_coordinates
                              ((etc1_solution_coordinates *)
                               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                               (uint)in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                               (uint)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                               (uint)in_stack_ffffffffffffff30,false);
                    if (**(int **)in_RDI == 2) {
                      bVar13 = evaluate_solution((etc1_optimizer *)CONCAT44(uVar20,iVar19),
                                                 (etc1_solution_coordinates *)
                                                 CONCAT44(iVar18,iVar17),
                                                 (potential_solution *)CONCAT44(uVar1,iVar16),
                                                 (potential_solution *)CONCAT44(iVar15,uVar2));
                    }
                    else {
                      bVar13 = evaluate_solution_fast
                                         ((etc1_optimizer *)
                                          CONCAT17(in_stack_ffffffffffffffff,
                                                   in_stack_fffffffffffffff8),coords_00,
                                          (potential_solution *)CONCAT44(uVar20,iVar19),
                                          (potential_solution *)CONCAT44(iVar18,iVar17));
                    }
                    if (!bVar13) break;
                  }
                }
              }
              else {
                bVar13 = evaluate_solution_fast
                                   ((etc1_optimizer *)
                                    CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                                    coords_00,(potential_solution *)CONCAT44(uVar20,iVar19),
                                    (potential_solution *)CONCAT44(iVar18,iVar17));
                if (bVar13) goto LAB_0021e23a;
              }
            }
          }
        }
      }
    }
  }
  bVar13 = (in_RDI[0xf].m_inten_table & 1) != 0;
  if (bVar13) {
    __src = vector<unsigned_char>::get_ptr((vector<unsigned_char> *)&in_RDI[0xd].m_inten_table);
    **(undefined8 **)&in_RDI->m_color4 = *(undefined8 *)&in_RDI[0xe].m_color4;
    color_quad<unsigned_char,_int>::operator=
              ((color_quad<unsigned_char,_int> *)(*(long *)&in_RDI->m_color4 + 8),
               &in_RDI[0xc].m_unscaled_color);
    *(byte *)(*(long *)&in_RDI->m_color4 + 0x20) = in_RDI[0xc].m_color4 & 1;
    *(uint *)(*(long *)&in_RDI->m_color4 + 0xc) = in_RDI[0xc].m_inten_table;
    memcpy(*(void **)(*(long *)&in_RDI->m_color4 + 0x18),__src,(ulong)uVar20);
    *(uint *)(*(long *)&in_RDI->m_color4 + 0x10) = uVar20;
  }
  else {
    **(undefined8 **)&in_RDI->m_color4 = 0xffffffff;
  }
  return bVar13;
}

Assistant:

bool etc1_optimizer::compute() {
  const uint n = m_pParams->m_num_src_pixels;
  const int scan_delta_size = m_pParams->m_scan_delta_size;

  // Scan through a subset of the 3D lattice centered around the avg block color trying each 3D (555 or 444) lattice point as a potential block color.
  // Each time a better solution is found try to refine the current solution's block color based of the current selectors and intensity table index.
  for (int zdi = 0; zdi < scan_delta_size; zdi++) {
    const int zd = m_pParams->m_pScan_deltas[zdi];
    const int mbb = m_bb + zd;
    if (mbb < 0)
      continue;
    else if (mbb > m_limit)
      break;

    for (int ydi = 0; ydi < scan_delta_size; ydi++) {
      const int yd = m_pParams->m_pScan_deltas[ydi];
      const int mbg = m_bg + yd;
      if (mbg < 0)
        continue;
      else if (mbg > m_limit)
        break;

      for (int xdi = 0; xdi < scan_delta_size; xdi++) {
        const int xd = m_pParams->m_pScan_deltas[xdi];
        const int mbr = m_br + xd;
        if (mbr < 0)
          continue;
        else if (mbr > m_limit)
          break;

        etc1_solution_coordinates coords(mbr, mbg, mbb, 0, m_pParams->m_use_color4);
        if (m_pParams->m_quality == cCRNETCQualitySlow) {
          if (!evaluate_solution(coords, m_trial_solution, &m_best_solution))
            continue;
        } else {
          if (!evaluate_solution_fast(coords, m_trial_solution, &m_best_solution))
            continue;
        }

        // Now we have the input block, the avg. color of the input pixels, a set of trial selector indices, and the block color+intensity index.
        // Now, for each component, attempt to refine the current solution by solving a simple linear equation. For example, for 4 colors:
        // The goal is:
        // pixel0 - (block_color+inten_table[selector0]) + pixel1 - (block_color+inten_table[selector1]) + pixel2 - (block_color+inten_table[selector2]) + pixel3 - (block_color+inten_table[selector3]) = 0
        // Rearranging this:
        // (pixel0 + pixel1 + pixel2 + pixel3) - (block_color+inten_table[selector0]) - (block_color+inten_table[selector1]) - (block_color+inten_table[selector2]) - (block_color+inten_table[selector3]) = 0
        // (pixel0 + pixel1 + pixel2 + pixel3) - block_color - inten_table[selector0] - block_color-inten_table[selector1] - block_color-inten_table[selector2] - block_color-inten_table[selector3] = 0
        // (pixel0 + pixel1 + pixel2 + pixel3) - 4*block_color - inten_table[selector0] - inten_table[selector1] - inten_table[selector2] - inten_table[selector3] = 0
        // (pixel0 + pixel1 + pixel2 + pixel3) - 4*block_color - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3]) = 0
        // (pixel0 + pixel1 + pixel2 + pixel3)/4 - block_color - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3])/4 = 0
        // block_color = (pixel0 + pixel1 + pixel2 + pixel3)/4 - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3])/4
        // So what this means:
        // optimal_block_color = avg_input - avg_inten_delta
        // So the optimal block color can be computed by taking the average block color and subtracting the current average of the intensity delta.
        // Unfortunately, optimal_block_color must then be quantized to 555 or 444 so it's not always possible to improve matters using this formula.
        // Also, the above formula is for unclamped intensity deltas. The actual implementation takes into account clamping.

        const uint max_refinement_trials = (m_pParams->m_quality == cCRNETCQualityFast) ? 2 : (((xd | yd | zd) == 0) ? 4 : 2);
        for (uint refinement_trial = 0; refinement_trial < max_refinement_trials; refinement_trial++) {
          const uint8* pSelectors = m_best_solution.m_selectors.get_ptr();
          const int* pInten_table = g_etc1_inten_tables[m_best_solution.m_coords.m_inten_table];

          int delta_sum_r = 0, delta_sum_g = 0, delta_sum_b = 0;
          const color_quad_u8 base_color(m_best_solution.m_coords.get_scaled_color());
          for (uint r = 0; r < n; r++) {
            const uint s = *pSelectors++;
            const int yd = pInten_table[s];
            // Compute actual delta being applied to each pixel, taking into account clamping.
            delta_sum_r += math::clamp<int>(base_color.r + yd, 0, 255) - base_color.r;
            delta_sum_g += math::clamp<int>(base_color.g + yd, 0, 255) - base_color.g;
            delta_sum_b += math::clamp<int>(base_color.b + yd, 0, 255) - base_color.b;
          }
          if ((!delta_sum_r) && (!delta_sum_g) && (!delta_sum_b))
            break;
          const float avg_delta_r_f = static_cast<float>(delta_sum_r) / n;
          const float avg_delta_g_f = static_cast<float>(delta_sum_g) / n;
          const float avg_delta_b_f = static_cast<float>(delta_sum_b) / n;
          const int br1 = math::clamp<int>(static_cast<uint>((m_avg_color[0] - avg_delta_r_f) * m_limit / 255.0f + .5f), 0, m_limit);
          const int bg1 = math::clamp<int>(static_cast<uint>((m_avg_color[1] - avg_delta_g_f) * m_limit / 255.0f + .5f), 0, m_limit);
          const int bb1 = math::clamp<int>(static_cast<uint>((m_avg_color[2] - avg_delta_b_f) * m_limit / 255.0f + .5f), 0, m_limit);

          bool skip = false;

          if ((mbr == br1) && (mbg == bg1) && (mbb == bb1))
            skip = true;
          else if ((br1 == m_best_solution.m_coords.m_unscaled_color.r) && (bg1 == m_best_solution.m_coords.m_unscaled_color.g) && (bb1 == m_best_solution.m_coords.m_unscaled_color.b))
            skip = true;
          else if ((m_br == br1) && (m_bg == bg1) && (m_bb == bb1))
            skip = true;

          if (skip)
            break;

          etc1_solution_coordinates coords1(br1, bg1, bb1, 0, m_pParams->m_use_color4);
          if (m_pParams->m_quality == cCRNETCQualitySlow) {
            if (!evaluate_solution(coords1, m_trial_solution, &m_best_solution))
              break;
          } else {
            if (!evaluate_solution_fast(coords1, m_trial_solution, &m_best_solution))
              break;
          }

        }  // refinement_trial

      }  // xdi
    }    // ydi
  }      // zdi

  if (!m_best_solution.m_valid) {
    m_pResult->m_error = cUINT32_MAX;
    return false;
  }

  const uint8* pSelectors = m_best_solution.m_selectors.get_ptr();

#ifdef CRNLIB_BUILD_DEBUG
  {
    color_quad_u8 block_colors[4];
    m_best_solution.m_coords.get_block_colors(block_colors);

    const color_quad_u8* pSrc_pixels = m_pParams->m_pSrc_pixels;
    uint64 actual_error = 0;
    for (uint i = 0; i < n; i++)
      actual_error += color::elucidian_distance(pSrc_pixels[i], block_colors[pSelectors[i]], false);

    CRNLIB_ASSERT(actual_error == m_best_solution.m_error);
  }
#endif

  m_pResult->m_error = m_best_solution.m_error;

  m_pResult->m_block_color_unscaled = m_best_solution.m_coords.m_unscaled_color;
  m_pResult->m_block_color4 = m_best_solution.m_coords.m_color4;

  m_pResult->m_block_inten_table = m_best_solution.m_coords.m_inten_table;
  memcpy(m_pResult->m_pSelectors, pSelectors, n);
  m_pResult->m_n = n;

  return true;
}